

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

void __thiscall leveldb::FilterBlockBuilder::GenerateFilter(FilterBlockBuilder *this)

{
  value_type vVar1;
  FilterPolicy *pFVar2;
  long lVar3;
  reference pvVar4;
  reference pvVar5;
  value_type_conflict1 local_54;
  Slice local_50;
  size_t local_40;
  size_t length;
  char *base;
  size_t i;
  value_type_conflict1 local_1c;
  char *local_18;
  size_t num_keys;
  FilterBlockBuilder *this_local;
  
  num_keys = (size_t)this;
  local_18 = (char *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->start_)
  ;
  if (local_18 == (char *)0x0) {
    local_1c = std::__cxx11::string::size();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->filter_offsets_,&local_1c);
  }
  else {
    i = std::__cxx11::string::size();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->start_,&i);
    std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::resize
              (&this->tmp_keys_,(size_type)local_18);
    for (base = (char *)0x0; base < local_18; base = base + 1) {
      lVar3 = std::__cxx11::string::data();
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->start_,(size_type)base);
      length = lVar3 + *pvVar4;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->start_,(size_type)(base + 1));
      vVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->start_,(size_type)base);
      local_40 = vVar1 - *pvVar4;
      Slice::Slice(&local_50,(char *)length,local_40);
      pvVar5 = std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::operator[]
                         (&this->tmp_keys_,(size_type)base);
      pvVar5->data_ = local_50.data_;
      pvVar5->size_ = local_50.size_;
    }
    local_54 = std::__cxx11::string::size();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->filter_offsets_,&local_54);
    pFVar2 = this->policy_;
    pvVar5 = std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::operator[]
                       (&this->tmp_keys_,0);
    (*pFVar2->_vptr_FilterPolicy[3])(pFVar2,pvVar5,(ulong)local_18 & 0xffffffff,&this->result_);
    std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::clear(&this->tmp_keys_);
    std::__cxx11::string::clear();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->start_);
  }
  return;
}

Assistant:

void FilterBlockBuilder::GenerateFilter() {
  const size_t num_keys = start_.size();
  if (num_keys == 0) {
    // Fast path if there are no keys for this filter
    filter_offsets_.push_back(result_.size());
    return;
  }

  // Make list of keys from flattened key structure
  start_.push_back(keys_.size());  // Simplify length computation
  tmp_keys_.resize(num_keys);
  for (size_t i = 0; i < num_keys; i++) {
    const char* base = keys_.data() + start_[i];
    size_t length = start_[i + 1] - start_[i];
    tmp_keys_[i] = Slice(base, length);
  }

  // Generate filter for current set of keys and append to result_.
  filter_offsets_.push_back(result_.size());
  policy_->CreateFilter(&tmp_keys_[0], static_cast<int>(num_keys), &result_);

  tmp_keys_.clear();
  keys_.clear();
  start_.clear();
}